

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

pair<unsigned_long,_unsigned_long>
slang::ast::dynamicBitstreamSize(Type *type,BitstreamSizeMode mode)

{
  pair<unsigned_long,_unsigned_long> pVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  bool bVar5;
  bitwidth_t bVar6;
  int iVar7;
  Type *pTVar8;
  FixedSizeUnpackedArrayType *pFVar9;
  UnpackedStructType *pUVar10;
  FieldSymbol *pFVar11;
  ClassType *pCVar12;
  ClassPropertySymbol *pCVar13;
  unsigned_long uVar14;
  int iVar15;
  _Ct __m2;
  _Ct __n2;
  unsigned_long uVar16;
  pair<unsigned_long,_unsigned_long> pVar17;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_> iVar18;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
  iVar19;
  specific_symbol_iterator<slang::ast::FieldSymbol> __begin4;
  specific_symbol_iterator<slang::ast::FieldSymbol> local_38;
  
  bVar6 = Type::getBitWidth(type);
  if (bVar6 != 0) {
    return (pair<unsigned_long,_unsigned_long>)(ZEXT416(bVar6) << 0x40);
  }
  bVar5 = Type::isString(type);
  if (bVar5) {
    uVar14 = (ulong)(mode != DestEmpty) << 3;
  }
  else {
    bVar5 = Type::isUnpackedArray(type);
    if (bVar5) {
      pTVar8 = Type::getArrayElementType(type);
      pVar17 = dynamicBitstreamSize(pTVar8,mode);
      uVar16 = pVar17.second;
      uVar14 = pVar17.first;
      pVar1.second = uVar14;
      pVar1.first = uVar16;
      pTVar8 = Type::getCanonicalType(type);
      if ((pTVar8->super_Symbol).kind == FixedSizeUnpackedArrayType) {
        pFVar9 = Symbol::as<slang::ast::FixedSizeUnpackedArrayType>(&pTVar8->super_Symbol);
        iVar15 = (pFVar9->range).left - (pFVar9->range).right;
        iVar7 = -iVar15;
        if (0 < iVar15) {
          iVar7 = iVar15;
        }
        pVar3.second = uVar16 * (iVar7 + 1);
        pVar3.first = uVar14 * (iVar7 + 1);
        return pVar3;
      }
      if (mode == Source) {
        uVar14 = std::__detail::__gcd<unsigned_long>(uVar14,uVar16);
        goto LAB_001e29cc;
      }
      if (mode == DestFill) {
        if (uVar14 != 0) {
          return pVar17;
        }
        return pVar1;
      }
    }
    else {
      bVar5 = Type::isUnpackedStruct(type);
      if (bVar5) {
        pTVar8 = Type::getCanonicalType(type);
        pUVar10 = Symbol::as<slang::ast::UnpackedStructType>(&pTVar8->super_Symbol);
        iVar18 = Scope::membersOfType<slang::ast::FieldSymbol>(&pUVar10->super_Scope);
        local_38 = iVar18.m_begin.current;
        uVar14 = 0;
        uVar16 = 0;
        while (pVar17.second = uVar16, pVar17.first = uVar14,
              local_38.current != iVar18.m_end.current.current) {
          pFVar11 = Symbol::as<slang::ast::FieldSymbol>(local_38.current);
          pTVar8 = DeclaredType::getType
                             (&(pFVar11->super_VariableSymbol).super_ValueSymbol.declaredType);
          pVar17 = dynamicBitstreamSize(pTVar8,mode);
          if (mode == DestFill) {
            mode = (pVar17.first == 0) + DestEmpty;
          }
          uVar14 = std::__detail::__gcd<unsigned_long>(uVar14,pVar17.first);
          uVar16 = uVar16 + pVar17.second;
          Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::operator++(&local_38);
        }
        return pVar17;
      }
      bVar5 = Type::isClass(type);
      if (bVar5) {
        pTVar8 = Type::getCanonicalType(type);
        pCVar12 = Symbol::as<slang::ast::ClassType>(&pTVar8->super_Symbol);
        iVar19 = Scope::membersOfType<slang::ast::ClassPropertySymbol>(&pCVar12->super_Scope);
        local_38.current = (Symbol *)iVar19.m_begin.current;
        uVar14 = 0;
        uVar16 = 0;
        while (pVar4.second = uVar16, pVar4.first = uVar14,
              local_38.current != iVar19.m_end.current.current) {
          pCVar13 = Symbol::as<slang::ast::ClassPropertySymbol>(local_38.current);
          pTVar8 = DeclaredType::getType
                             (&(pCVar13->super_VariableSymbol).super_ValueSymbol.declaredType);
          pVar17 = dynamicBitstreamSize(pTVar8,mode);
          uVar14 = std::__detail::__gcd<unsigned_long>(uVar14,pVar17.first);
          uVar16 = uVar16 + pVar17.second;
          Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>::operator++
                    ((specific_symbol_iterator<slang::ast::ClassPropertySymbol> *)&local_38);
        }
        return pVar4;
      }
    }
    uVar14 = 0;
  }
LAB_001e29cc:
  pVar2.second = 0;
  pVar2.first = uVar14;
  return pVar2;
}

Assistant:

static std::pair<size_t, size_t> dynamicBitstreamSize(const Type& type, BitstreamSizeMode mode) {
    size_t fixedSize = type.getBitWidth();
    if (fixedSize > 0)
        return {0, fixedSize};

    if (type.isString())
        return {mode == BitstreamSizeMode::DestEmpty ? 0 : CHAR_BIT, 0};

    // TODO: check for overflow
    size_t multiplier = 0;
    if (type.isUnpackedArray()) {
        auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(*type.getArrayElementType(),
                                                                    mode);

        const auto& ct = type.getCanonicalType();
        if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
            auto rw = ct.as<FixedSizeUnpackedArrayType>().range.width();
            multiplier = multiplierElem * rw;
            fixedSize = fixedSizeElem * rw;
        }
        else if (mode == BitstreamSizeMode::DestFill) {
            if (!multiplierElem)
                multiplier = fixedSizeElem; // element is fixed size
            else {
                multiplier = multiplierElem; // element is dynamically sized
                fixedSize = fixedSizeElem;
            }
        }
        else if (mode == BitstreamSizeMode::Source) {
            multiplier = std::gcd(multiplierElem, fixedSizeElem);
        }
    }
    else if (type.isUnpackedStruct()) {
        auto& us = type.getCanonicalType().as<UnpackedStructType>();
        for (auto& field : us.membersOfType<FieldSymbol>()) {
            auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(field.getType(), mode);
            if (mode == BitstreamSizeMode::DestFill && multiplierElem > 0) {
                // dynamically sized field filled and rest should be empty
                mode = BitstreamSizeMode::DestEmpty;
            }

            multiplier = std::gcd(multiplier, multiplierElem);
            fixedSize += fixedSizeElem;
        }
    }
    else if (type.isClass()) {
        auto& ct = type.getCanonicalType().as<ClassType>();
        for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
            auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(prop.getType(), mode);
            multiplier = std::gcd(multiplier, multiplierElem);
            fixedSize += fixedSizeElem;
        }
    }

    return {multiplier, fixedSize};
}